

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmac.c
# Opt level: O1

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,uchar *input,size_t ilen)

{
  mbedtls_cmac_context_t *input_00;
  size_t sVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  size_t local_48;
  size_t olen;
  mbedtls_cipher_context_t *local_38;
  ulong ilen_00;
  
  iVar2 = -0x6100;
  if (((ctx != (mbedtls_cipher_context_t *)0x0) &&
      (iVar2 = -0x6100, input != (uchar *)0x0 && ctx->cipher_info != (mbedtls_cipher_info_t *)0x0))
     && (input_00 = ctx->cmac_ctx, input_00 != (mbedtls_cmac_context_t *)0x0)) {
    uVar8 = *(uint *)&ctx->cipher_info->field_0x8 & 0x1f;
    ilen_00 = (ulong)uVar8;
    sVar1 = input_00->unprocessed_len;
    if ((sVar1 != 0) && (ilen_00 - sVar1 < ilen)) {
      memcpy(input_00->unprocessed_block + sVar1,input,ilen_00 - sVar1);
      if (uVar8 < 8) {
        uVar3 = 0;
      }
      else {
        uVar7 = 0;
        do {
          *(ulong *)(input_00->state + uVar7) =
               *(ulong *)(input_00->state + uVar7) ^ *(ulong *)(input_00->unprocessed_block + uVar7)
          ;
          uVar3 = uVar7 + 8;
          uVar5 = uVar7 + 0x10;
          uVar7 = uVar3;
        } while (uVar5 <= ilen_00);
      }
      if (uVar3 < ilen_00) {
        do {
          input_00->state[uVar3] = input_00->state[uVar3] ^ input_00->unprocessed_block[uVar3];
          uVar3 = uVar3 + 1;
        } while (ilen_00 != uVar3);
      }
      iVar2 = mbedtls_cipher_update(ctx,input_00->state,ilen_00,input_00->state,&local_48);
      if (iVar2 != 0) {
        return iVar2;
      }
      lVar4 = ilen_00 - input_00->unprocessed_len;
      input = input + lVar4;
      ilen = ilen - lVar4;
      input_00->unprocessed_len = 0;
    }
    olen = ((ilen + ilen_00) - 1) / ilen_00;
    if (1 < olen) {
      uVar7 = 1;
      local_38 = ctx;
      do {
        if (uVar8 < 8) {
          uVar5 = 0;
        }
        else {
          uVar3 = 0;
          do {
            *(ulong *)(input_00->state + uVar3) =
                 *(ulong *)(input_00->state + uVar3) ^ *(ulong *)(input + uVar3);
            uVar5 = uVar3 + 8;
            uVar6 = uVar3 + 0x10;
            uVar3 = uVar5;
          } while (uVar6 <= ilen_00);
        }
        if (uVar5 < ilen_00) {
          do {
            input_00->state[uVar5] = input_00->state[uVar5] ^ input[uVar5];
            uVar5 = uVar5 + 1;
          } while (ilen_00 != uVar5);
        }
        iVar2 = mbedtls_cipher_update(local_38,input_00->state,ilen_00,input_00->state,&local_48);
        if (iVar2 != 0) {
          return iVar2;
        }
        ilen = ilen - ilen_00;
        input = input + ilen_00;
        uVar7 = uVar7 + 1;
      } while (uVar7 < olen);
    }
    if (ilen != 0) {
      memcpy(input_00->unprocessed_block + input_00->unprocessed_len,input,ilen);
      input_00->unprocessed_len = input_00->unprocessed_len + ilen;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int mbedtls_cipher_cmac_update(mbedtls_cipher_context_t *ctx,
                               const unsigned char *input, size_t ilen)
{
    mbedtls_cmac_context_t *cmac_ctx;
    unsigned char *state;
    int ret = 0;
    size_t n, j, olen, block_size;

    if (ctx == NULL || ctx->cipher_info == NULL || input == NULL ||
        ctx->cmac_ctx == NULL) {
        return MBEDTLS_ERR_CIPHER_BAD_INPUT_DATA;
    }

    cmac_ctx = ctx->cmac_ctx;
    block_size = mbedtls_cipher_info_get_block_size(ctx->cipher_info);
    state = ctx->cmac_ctx->state;

    /* Is there data still to process from the last call, that's greater in
     * size than a block? */
    if (cmac_ctx->unprocessed_len > 0 &&
        ilen > block_size - cmac_ctx->unprocessed_len) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               block_size - cmac_ctx->unprocessed_len);

        mbedtls_xor_no_simd(state, cmac_ctx->unprocessed_block, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        input += block_size - cmac_ctx->unprocessed_len;
        ilen -= block_size - cmac_ctx->unprocessed_len;
        cmac_ctx->unprocessed_len = 0;
    }

    /* n is the number of blocks including any final partial block */
    n = (ilen + block_size - 1) / block_size;

    /* Iterate across the input data in block sized chunks, excluding any
     * final partial or complete block */
    for (j = 1; j < n; j++) {
        mbedtls_xor_no_simd(state, input, state, block_size);

        if ((ret = mbedtls_cipher_update(ctx, state, block_size, state,
                                         &olen)) != 0) {
            goto exit;
        }

        ilen -= block_size;
        input += block_size;
    }

    /* If there is data left over that wasn't aligned to a block */
    if (ilen > 0) {
        memcpy(&cmac_ctx->unprocessed_block[cmac_ctx->unprocessed_len],
               input,
               ilen);
        cmac_ctx->unprocessed_len += ilen;
    }

exit:
    return ret;
}